

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::BlockCoverageEventSyntax::setChild
          (BlockCoverageEventSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00406ba0 + *(int *)(&DAT_00406ba0 + index * 4)))();
  return;
}

Assistant:

void BlockCoverageEventSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: atat = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<BlockEventExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}